

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMHighLevelEncoder.cpp
# Opt level: O0

void ZXing::DataMatrix::C40Encoder::EncodeC40
               (EncoderContext *context,
               function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *encodeChar,int encodingMode)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  int in_EDX;
  EncoderContext *in_RSI;
  EncoderContext *in_RDI;
  int newMode;
  string removed;
  int available;
  SymbolInfo *symbolInfo;
  int curCodewordCount;
  int unwritten;
  int lastCharSize;
  int c;
  string buffer;
  int in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  int iVar4;
  int in_stack_fffffffffffffedc;
  EncoderContext *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  SymbolInfo *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  int in_stack_ffffffffffffff1c;
  string local_90 [36];
  int local_6c;
  SymbolInfo *local_68;
  int local_5c;
  ulong local_58;
  int local_50;
  int local_4c;
  int local_48;
  string local_38 [20];
  int in_stack_ffffffffffffffdc;
  size_t in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  
  std::__cxx11::string::string(local_38);
  do {
    do {
      bVar1 = EncoderContext::hasMoreCharacters
                        ((EncoderContext *)
                         CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      in_stack_ffffffffffffff1c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff1c);
      if (!bVar1) goto LAB_00282204;
      local_48 = EncoderContext::currentChar((EncoderContext *)0x281e3d);
      iVar2 = EncoderContext::currentPos(in_RDI);
      EncoderContext::setCurrentPos(in_RDI,iVar2 + 1);
      local_4c = std::
                 function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                 ::operator()((function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                               *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                              (int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      local_58 = std::__cxx11::string::length();
      local_58 = local_58 / 3;
      local_50 = narrow_cast<int,unsigned_long>(&local_58);
      local_50 = local_50 * 2;
      in_stack_ffffffffffffff04 = EncoderContext::codewordCount((EncoderContext *)0x281ee0);
      local_5c = in_stack_ffffffffffffff04 + local_50;
      in_stack_fffffffffffffef8 = EncoderContext::updateSymbolInfo(in_RSI,in_stack_ffffffffffffff1c)
      ;
      local_68 = in_stack_fffffffffffffef8;
      iVar2 = SymbolInfo::dataCapacity(in_stack_fffffffffffffef8);
      local_6c = iVar2 - local_5c;
      bVar1 = EncoderContext::hasMoreCharacters
                        ((EncoderContext *)
                         CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      in_stack_fffffffffffffef0 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffef0);
      if (!bVar1) {
        std::__cxx11::string::string(local_90);
        uVar3 = std::__cxx11::string::length();
        if ((uVar3 % 3 == 2) && (local_6c != 2)) {
          in_stack_fffffffffffffee0 = in_RDI;
          in_stack_fffffffffffffeec = local_4c;
          std::
          function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::function((function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                     in_stack_fffffffffffffec8);
          in_stack_fffffffffffffedc =
               BacktrackOneCharacter
                         ((EncoderContext *)CONCAT44(iVar2,in_stack_fffffffffffffef0),
                          (string *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                          &in_stack_fffffffffffffee0->_msg,in_stack_fffffffffffffedc,
                          (function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                           *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
          local_4c = in_stack_fffffffffffffedc;
          std::
          function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::~function((function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)0x282016);
        }
        while( true ) {
          uVar3 = std::__cxx11::string::length();
          bVar1 = false;
          if ((uVar3 % 3 == 1) && ((3 < local_4c || (bVar1 = true, local_6c == 1)))) {
            bVar1 = 3 < local_4c;
          }
          if (!bVar1) break;
          iVar4 = local_4c;
          std::
          function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::function((function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)CONCAT44(local_4c,in_stack_fffffffffffffed0),
                     (function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)in_RDI);
          local_4c = BacktrackOneCharacter
                               ((EncoderContext *)CONCAT44(iVar2,in_stack_fffffffffffffef0),
                                (string *)
                                CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                                &in_stack_fffffffffffffee0->_msg,in_stack_fffffffffffffedc,
                                (function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                 *)CONCAT44(iVar4,in_stack_fffffffffffffed0));
          std::
          function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::~function((function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)0x28213a);
        }
        std::__cxx11::string::~string(local_90);
        goto LAB_00282204;
      }
      uVar3 = std::__cxx11::string::length();
    } while (uVar3 % 3 != 0);
    EncoderContext::message_abi_cxx11_(in_RDI);
    EncoderContext::currentPos(in_RDI);
    in_stack_fffffffffffffec0 =
         LookAheadTest((string *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                       in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  } while (in_stack_fffffffffffffec0 == in_EDX);
  EncoderContext::setNewEncoding(in_RDI,0);
LAB_00282204:
  HandleEOD((EncoderContext *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
            (string *)in_stack_fffffffffffffef8);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

static void EncodeC40(EncoderContext& context, std::function<int (int, std::string&)> encodeChar, int encodingMode)
	{
		//step C
		std::string buffer;
		while (context.hasMoreCharacters()) {
			int c = context.currentChar();
			context.setCurrentPos(context.currentPos() + 1);
			int lastCharSize = encodeChar(c, buffer);
			int unwritten = narrow_cast<int>(buffer.length() / 3) * 2;
			int curCodewordCount = context.codewordCount() + unwritten;
			auto symbolInfo = context.updateSymbolInfo(curCodewordCount);
			int available = symbolInfo->dataCapacity() - curCodewordCount;

			if (!context.hasMoreCharacters()) {
				//Avoid having a single C40 value in the last triplet
				std::string removed;
				if ((buffer.length() % 3) == 2 && available != 2) {
					lastCharSize = BacktrackOneCharacter(context, buffer, removed, lastCharSize, encodeChar);
				}
				while ((buffer.length() % 3) == 1 && ((lastCharSize <= 3 && available != 1) || lastCharSize > 3)) {
					lastCharSize = BacktrackOneCharacter(context, buffer, removed, lastCharSize, encodeChar);
				}
				break;
			}

			if ((buffer.length() % 3) == 0) {
				int newMode = LookAheadTest(context.message(), context.currentPos(), encodingMode);
				if (newMode != encodingMode) {
					// Return to ASCII encodation, which will actually handle latch to new mode
					context.setNewEncoding(ASCII_ENCODATION);
					break;
				}
			}
		}
		return HandleEOD(context, buffer);
	}